

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings_p.h
# Opt level: O0

QString * __thiscall QSettingsGroup::toString(QSettingsGroup *this)

{
  long in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *result;
  QString *in_stack_ffffffffffffff88;
  QString *in_stack_ffffffffffffff90;
  QString *pQVar1;
  int base;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = in_RDI;
  QString::QString((QString *)0x7bb1d1);
  base = (int)((ulong)pQVar1 >> 0x20);
  QString::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (0 < *(long *)(in_RSI + 0x18)) {
    QChar::QChar<char16_t,_true>(&local_a,L'/');
    QString::operator+=(in_stack_ffffffffffffff90,(QChar)(char16_t)((ulong)in_RDI >> 0x30));
    QString::number(in_RSI,base);
    QString::operator+=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    QString::~QString((QString *)0x7bb245);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

inline QString QSettingsGroup::toString() const
{
    QString result;
    result = str;
    if (num > 0) {
        result += u'/';
        result += QString::number(num);
    }
    return result;
}